

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parser.cpp
# Opt level: O0

void franca::error_handler(char *begin,char *end,char *where,info *what)

{
  char *__end;
  iterator_type __beg;
  difference_type dVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  void *this;
  allocator<char> local_d9;
  string local_d8 [55];
  allocator<char> local_a1;
  string local_a0 [39];
  char local_79;
  long local_78;
  difference_type line_nr;
  char *local_68;
  char *line_end;
  reverse_iterator<const_char_*> local_58;
  reverse_iterator<const_char_*> local_50;
  reverse_iterator<const_char_*> local_48;
  iterator_type local_40;
  iterator_type line_begin;
  reverse_iterator<const_char_*> rev_where;
  reverse_iterator<const_char_*> rev_end;
  info *what_local;
  char *where_local;
  char *end_local;
  char *begin_local;
  
  std::reverse_iterator<const_char_*>::reverse_iterator(&rev_where,begin);
  std::reverse_iterator<const_char_*>::reverse_iterator
            ((reverse_iterator<const_char_*> *)&line_begin,where);
  std::reverse_iterator<const_char_*>::reverse_iterator
            (&local_50,(reverse_iterator<const_char_*> *)&line_begin);
  std::reverse_iterator<const_char_*>::reverse_iterator(&local_58,&rev_where);
  line_end._7_1_ = 10;
  std::find<std::reverse_iterator<char_const*>,char>(&local_48,&local_50,(char *)&local_58);
  local_40 = std::reverse_iterator<const_char_*>::base(&local_48);
  line_nr._7_1_ = 10;
  local_68 = std::find<char_const*,char>(where,end,(char *)((long)&line_nr + 7));
  local_79 = '\n';
  dVar1 = std::count<char_const*,char>(begin,where,&local_79);
  local_78 = dVar1 + 1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Expecting ");
  pbVar3 = boost::spirit::operator<<(poVar2,what);
  poVar2 = std::operator<<(pbVar3," in line ");
  this = (void *)std::ostream::operator<<(poVar2,local_78);
  poVar2 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  __beg = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_a0,__beg,where,&local_a1);
  poVar2 = std::operator<<(poVar2,local_a0);
  poVar2 = std::operator<<(poVar2,"\x1b[1;31m");
  __end = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_d8,where,__end,&local_d9);
  poVar2 = std::operator<<(poVar2,local_d8);
  poVar2 = std::operator<<(poVar2,"\x1b[0m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  return;
}

Assistant:

void error_handler(const char* begin, const char* end, const char* where,
		boost::spirit::qi::info const& what)
{
	std::reverse_iterator<const char*> rev_end(begin);
	std::reverse_iterator<const char*> rev_where(where);

	auto const line_begin = std::find(rev_where, rev_end, '\n').base();
	auto const line_end = std::find(where, end, '\n');

	auto const line_nr = 1 + std::count(begin, where, '\n');

	std::cout
		<< "Expecting " << what << " in line " << line_nr << std::endl
		<< std::string(line_begin, where)
		<< "\033[1;31m"
		<< std::string(where, line_end)
		<< "\033[0m"
		<< std::endl
		;
}